

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void __thiscall
setup::info::load_entries<setup::data_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::data_entry,_std::allocator<setup::data_entry>_> *result,enum_type entry_type
          )

{
  pointer pdVar1;
  long lVar2;
  data_entry entry;
  data_entry local_b0;
  
  pdVar1 = (result->super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (result->super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>)._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  if (NoUnknownVersion < entry_type) {
    std::__throw_out_of_range_fmt
              ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",(ulong)entry_type
               ,0x15);
  }
  if (((ulong)entries._flags.super__Base_bitset<1UL>._M_w >> ((ulong)entry_type & 0x3f) & 1) == 0) {
    if (count != 0) {
      do {
        local_b0.options._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
        data_entry::load(&local_b0,is,this);
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    std::vector<setup::data_entry,_std::allocator<setup::data_entry>_>::resize(result,count);
    if (count != 0) {
      lVar2 = 0;
      do {
        data_entry::load((data_entry *)
                         ((long)&(((result->
                                   super__Vector_base<setup::data_entry,_std::allocator<setup::data_entry>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->chunk).first_slice +
                         lVar2),is,this);
        lVar2 = lVar2 + 0x88;
        count = count - 1;
      } while (count != 0);
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}